

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O2

_Bool sftp_get_file(char *fname,char *outfname,_Bool recurse,_Bool restart)

{
  size_t sVar1;
  _Bool _Var2;
  _Bool _Var3;
  bool bVar4;
  int iVar5;
  sftp_request *psVar6;
  sftp_packet *psVar7;
  fxp_handle *handle;
  WFile *f;
  uint64_t offset;
  char *pcVar8;
  char *pcVar9;
  fxp_xfer *xfer;
  fxp_names *names;
  fxp_name *pfVar10;
  wchar_t wVar11;
  undefined7 in_register_00000011;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  void *local_98;
  wchar_t len;
  size_t namesize;
  fxp_handle *local_78;
  char *local_70;
  fxp_attrs attrs;
  
  if ((int)CONCAT71(in_register_00000011,recurse) != 0) {
    psVar6 = fxp_stat_send(fname);
    psVar7 = sftp_wait_for_reply(psVar6);
    _Var2 = fxp_stat_recv(psVar7,psVar6,&attrs);
    if (((_Var2) && ((attrs.flags & 4) != 0)) && ((attrs.permissions._1_1_ & 0x40) != 0)) {
      iVar5 = file_type(outfname);
      if ((iVar5 != 2) && (_Var2 = create_directory(outfname), !_Var2)) {
        pcVar8 = stripctrl_string(string_scc,outfname);
        while (pcVar8 != (char *)0x0) {
          printf("%s: Cannot create directory\n",pcVar8);
          safefree(pcVar8);
          pcVar8 = (char *)0x0;
        }
        return false;
      }
      psVar6 = fxp_opendir_send(fname);
      psVar7 = sftp_wait_for_reply(psVar6);
      local_78 = fxp_opendir_recv(psVar7,psVar6);
      if (local_78 == (fxp_handle *)0x0) {
        pcVar8 = stripctrl_string(string_scc,fname);
        while (pcVar8 != (char *)0x0) {
          pcVar9 = fxp_error();
          printf("%s: unable to open directory: %s\n",pcVar8,pcVar9);
          safefree(pcVar8);
          pcVar8 = (char *)0x0;
        }
        return false;
      }
      namesize = 0;
      local_98 = (void *)0x0;
      uVar14 = 0;
      local_70 = fname;
      while( true ) {
        psVar6 = fxp_readdir_send(local_78);
        psVar7 = sftp_wait_for_reply(psVar6);
        names = fxp_readdir_recv(psVar7,psVar6);
        if (names == (fxp_names *)0x0) break;
        if ((long)names->nnames == 0) {
          fxp_free_names(names);
          goto LAB_0010f169;
        }
        local_98 = safegrowarray(local_98,&namesize,8,uVar14,(long)names->nnames,false);
        for (lVar12 = 0; lVar12 < names->nnames; lVar12 = lVar12 + 1) {
          pcVar8 = names->names[lVar12].filename;
          if ((*pcVar8 != '.') ||
             ((pcVar8[1] != '\0' && ((pcVar8[1] != '.' || (pcVar8[2] != '\0')))))) {
            _Var2 = vet_filename(pcVar8);
            if (_Var2) {
              pfVar10 = fxp_dup_name(names->names + lVar12);
              *(fxp_name **)((long)local_98 + uVar14 * 8) = pfVar10;
              uVar14 = uVar14 + 1;
            }
            else {
              pcVar8 = stripctrl_string(string_scc,names->names[lVar12].filename);
              while (pcVar8 != (char *)0x0) {
                printf("ignoring potentially dangerous server-supplied filename \'%s\'\n",pcVar8);
                safefree(pcVar8);
                pcVar8 = (char *)0x0;
              }
            }
          }
        }
        fxp_free_names(names);
      }
      iVar5 = fxp_error_type();
      if (iVar5 == 1) {
LAB_0010f169:
        psVar6 = fxp_close_send(local_78);
        psVar7 = sftp_wait_for_reply(psVar6);
        fxp_close_recv(psVar7,psVar6);
        if (uVar14 != 0) {
          qsort(local_98,uVar14,8,sftp_name_compare);
        }
        iVar5 = 0;
        if (restart) {
          uVar13 = 0xffffffffffffffff;
          do {
            uVar15 = uVar14;
            if (uVar13 - uVar14 == -1) break;
            pcVar8 = dir_file_cat(outfname,(char *)**(undefined8 **)
                                                     ((long)local_98 + uVar13 * 8 + 8));
            iVar5 = file_type(pcVar8);
            safefree(pcVar8);
            uVar15 = uVar13 + 1;
            uVar13 = uVar15;
          } while (iVar5 != 0);
          iVar5 = (int)uVar15 + -1;
          if ((int)uVar15 == 0) {
            iVar5 = 0;
          }
        }
        uVar13 = (ulong)iVar5;
        do {
          if (uVar14 <= uVar13) {
            for (uVar13 = 0; uVar14 != uVar13; uVar13 = uVar13 + 1) {
              fxp_free_name(*(fxp_name **)((long)local_98 + uVar13 * 8));
            }
            safefree(local_98);
            return true;
          }
          pcVar8 = dupcat_fn(local_70,"/",**(undefined8 **)((long)local_98 + uVar13 * 8),0);
          pcVar9 = dir_file_cat(outfname,(char *)**(undefined8 **)((long)local_98 + uVar13 * 8));
          _Var2 = sftp_get_file(pcVar8,pcVar9,true,(_Bool)(restart & 1));
          safefree(pcVar9);
          safefree(pcVar8);
          uVar13 = uVar13 + 1;
          restart = false;
        } while (_Var2);
        for (uVar13 = 0; uVar14 != uVar13; uVar13 = uVar13 + 1) {
          fxp_free_name(*(fxp_name **)((long)local_98 + uVar13 * 8));
        }
      }
      else {
        pcVar8 = stripctrl_string(string_scc,local_70);
        while (pcVar8 != (char *)0x0) {
          pcVar9 = fxp_error();
          printf("%s: reading directory: %s\n",pcVar8,pcVar9);
          safefree(pcVar8);
          pcVar8 = (char *)0x0;
        }
        psVar6 = fxp_close_send(local_78);
        psVar7 = sftp_wait_for_reply(psVar6);
        fxp_close_recv(psVar7,psVar6);
      }
      safefree(local_98);
      return false;
    }
  }
  psVar6 = fxp_stat_send(fname);
  psVar7 = sftp_wait_for_reply(psVar6);
  _Var2 = fxp_stat_recv(psVar7,psVar6,&attrs);
  if (!_Var2) {
    attrs.flags = 0;
  }
  psVar6 = fxp_open_send(fname,1,(fxp_attrs *)0x0);
  psVar7 = sftp_wait_for_reply(psVar6);
  handle = fxp_open_recv(psVar7,psVar6);
  if (handle == (fxp_handle *)0x0) {
    pcVar8 = stripctrl_string(string_scc,fname);
    while (pcVar8 != (char *)0x0) {
      pcVar9 = fxp_error();
      printf("%s: open for read: %s\n",pcVar8,pcVar9);
      safefree(pcVar8);
      pcVar8 = (char *)0x0;
    }
    return false;
  }
  if (restart) {
    f = open_existing_wfile(outfname,(uint64_t *)0x0);
    if (f != (WFile *)0x0) {
      iVar5 = seek_file(f,0,2);
      if (iVar5 != -1) {
        offset = get_file_posn(f);
        printf("reget: restarting at file position %lu\n",offset);
        goto LAB_0010ecef;
      }
      close_wfile(f);
      pcVar8 = stripctrl_string(string_scc,outfname);
      while (pcVar8 != (char *)0x0) {
        printf("reget: cannot restart %s - file too large\n",pcVar8);
        safefree(pcVar8);
        pcVar8 = (char *)0x0;
      }
      goto LAB_0010ef09;
    }
  }
  else {
    offset = 0;
    f = open_new_file(outfname,-(ulong)((attrs.flags & 4) == 0) |
                               CONCAT62(attrs.permissions._2_6_,
                                        CONCAT11(attrs.permissions._1_1_,
                                                 (undefined1)attrs.permissions)));
    if (f != (WFile *)0x0) {
LAB_0010ecef:
      pcVar8 = stripctrl_string(string_scc,fname);
      while (pcVar8 != (char *)0x0) {
        pcVar9 = stripctrl_string(string_scc,outfname);
        while (pcVar9 != (char *)0x0) {
          printf("remote:%s => local:%s\n",pcVar8,pcVar9);
          safefree(pcVar9);
          pcVar9 = (char *)0x0;
        }
        safefree(pcVar8);
        pcVar8 = (char *)0x0;
      }
      xfer = xfer_download_init(handle,offset);
      _Var2 = true;
      bVar4 = false;
      do {
        _Var3 = xfer_done(xfer);
        if (_Var3) {
          xfer_cleanup(xfer);
          close_wfile(f);
          psVar6 = fxp_close_send(handle);
          psVar7 = sftp_wait_for_reply(psVar6);
          fxp_close_recv(psVar7,psVar6);
          return _Var2;
        }
        xfer_download_queue(xfer);
        psVar7 = sftp_recv();
        iVar5 = xfer_download_gotpkt(xfer,psVar7);
        if (iVar5 < 1) {
          if (!bVar4) {
            pcVar8 = fxp_error();
            printf("error while reading: %s\n",pcVar8);
          }
          bVar4 = true;
          _Var2 = false;
        }
        while (_Var3 = xfer_download_data(xfer,(void **)&namesize,&len), sVar1 = namesize, _Var3) {
          uVar14 = 0;
          do {
            wVar11 = (wchar_t)uVar14;
            if (len - wVar11 == 0 || len < wVar11) goto LAB_0010ee1c;
            iVar5 = write_to_file(f,(void *)(uVar14 + sVar1),len - wVar11);
            uVar14 = (ulong)(uint)(iVar5 + wVar11);
          } while (0 < iVar5);
          puts("error while writing local file");
          xfer_set_error(xfer);
          _Var2 = false;
LAB_0010ee1c:
          if (wVar11 < len) {
            xfer_set_error(xfer);
            _Var2 = false;
          }
          safefree((void *)namesize);
        }
      } while( true );
    }
  }
  pcVar8 = stripctrl_string(string_scc,outfname);
  while (pcVar8 != (char *)0x0) {
    printf("local: unable to open %s\n",pcVar8);
    safefree(pcVar8);
    pcVar8 = (char *)0x0;
  }
LAB_0010ef09:
  psVar6 = fxp_close_send(handle);
  psVar7 = sftp_wait_for_reply(psVar6);
  fxp_close_recv(psVar7,psVar6);
  return false;
}

Assistant:

bool sftp_get_file(char *fname, char *outfname, bool recurse, bool restart)
{
    struct fxp_handle *fh;
    struct sftp_packet *pktin;
    struct sftp_request *req;
    struct fxp_xfer *xfer;
    uint64_t offset;
    WFile *file;
    bool toret, shown_err = false;
    struct fxp_attrs attrs;

    /*
     * In recursive mode, see if we're dealing with a directory.
     * (If we're not in recursive mode, we need not even check: the
     * subsequent FXP_OPEN will return a usable error message.)
     */
    if (recurse) {
        bool result;

        req = fxp_stat_send(fname);
        pktin = sftp_wait_for_reply(req);
        result = fxp_stat_recv(pktin, req, &attrs);

        if (result &&
            (attrs.flags & SSH_FILEXFER_ATTR_PERMISSIONS) &&
            (attrs.permissions & 0040000)) {

            struct fxp_handle *dirhandle;
            size_t nnames, namesize;
            struct fxp_name **ournames;
            struct fxp_names *names;
            int i;

            /*
             * First, attempt to create the destination directory,
             * unless it already exists.
             */
            if (file_type(outfname) != FILE_TYPE_DIRECTORY &&
                !create_directory(outfname)) {
                with_stripctrl(san, outfname)
                    printf("%s: Cannot create directory\n", san);
                return false;
            }

            /*
             * Now get the list of filenames in the remote
             * directory.
             */
            req = fxp_opendir_send(fname);
            pktin = sftp_wait_for_reply(req);
            dirhandle = fxp_opendir_recv(pktin, req);

            if (!dirhandle) {
                with_stripctrl(san, fname)
                    printf("%s: unable to open directory: %s\n",
                           san, fxp_error());
                return false;
            }
            nnames = namesize = 0;
            ournames = NULL;
            while (1) {
                int i;

                req = fxp_readdir_send(dirhandle);
                pktin = sftp_wait_for_reply(req);
                names = fxp_readdir_recv(pktin, req);

                if (names == NULL) {
                    if (fxp_error_type() == SSH_FX_EOF)
                        break;
                    with_stripctrl(san, fname)
                        printf("%s: reading directory: %s\n",
                               san, fxp_error());

                    req = fxp_close_send(dirhandle);
                    pktin = sftp_wait_for_reply(req);
                    fxp_close_recv(pktin, req);

                    sfree(ournames);
                    return false;
                }
                if (names->nnames == 0) {
                    fxp_free_names(names);
                    break;
                }
                sgrowarrayn(ournames, namesize, nnames, names->nnames);
                for (i = 0; i < names->nnames; i++)
                    if (strcmp(names->names[i].filename, ".") &&
                        strcmp(names->names[i].filename, "..")) {
                        if (!vet_filename(names->names[i].filename)) {
                            with_stripctrl(san, names->names[i].filename)
                                printf("ignoring potentially dangerous server-"
                                       "supplied filename '%s'\n", san);
                        } else {
                            ournames[nnames++] =
                                fxp_dup_name(&names->names[i]);
                        }
                    }
                fxp_free_names(names);
            }
            req = fxp_close_send(dirhandle);
            pktin = sftp_wait_for_reply(req);
            fxp_close_recv(pktin, req);

            /*
             * Sort the names into a clear order. This ought to
             * make things more predictable when we're doing a
             * reget of the same directory, just in case two
             * readdirs on the same remote directory return a
             * different order.
             */
            if (nnames > 0)
                qsort(ournames, nnames, sizeof(*ournames), sftp_name_compare);

            /*
             * If we're in restart mode, find the last filename on
             * this list that already exists. We may have to do a
             * reget on _that_ file, but shouldn't have to do
             * anything on the previous files.
             *
             * If none of them exists, of course, we start at 0.
             */
            i = 0;
            if (restart) {
                while (i < nnames) {
                    char *nextoutfname;
                    bool nonexistent;
                    nextoutfname = dir_file_cat(outfname,
                                                ournames[i]->filename);
                    nonexistent = (file_type(nextoutfname) ==
                                   FILE_TYPE_NONEXISTENT);
                    sfree(nextoutfname);
                    if (nonexistent)
                        break;
                    i++;
                }
                if (i > 0)
                    i--;
            }

            /*
             * Now we're ready to recurse. Starting at ournames[i]
             * and continuing on to the end of the list, we
             * construct a new source and target file name, and
             * call sftp_get_file again.
             */
            for (; i < nnames; i++) {
                char *nextfname, *nextoutfname;
                bool retd;

                nextfname = dupcat(fname, "/", ournames[i]->filename);
                nextoutfname = dir_file_cat(outfname, ournames[i]->filename);
                retd = sftp_get_file(
                    nextfname, nextoutfname, recurse, restart);
                restart = false;       /* after first partial file, do full */
                sfree(nextoutfname);
                sfree(nextfname);
                if (!retd) {
                    for (i = 0; i < nnames; i++) {
                        fxp_free_name(ournames[i]);
                    }
                    sfree(ournames);
                    return false;
                }
            }

            /*
             * Done this recursion level. Free everything.
             */
            for (i = 0; i < nnames; i++) {
                fxp_free_name(ournames[i]);
            }
            sfree(ournames);

            return true;
        }
    }

    req = fxp_stat_send(fname);
    pktin = sftp_wait_for_reply(req);
    if (!fxp_stat_recv(pktin, req, &attrs))
        attrs.flags = 0;

    req = fxp_open_send(fname, SSH_FXF_READ, NULL);
    pktin = sftp_wait_for_reply(req);
    fh = fxp_open_recv(pktin, req);

    if (!fh) {
        with_stripctrl(san, fname)
            printf("%s: open for read: %s\n", san, fxp_error());
        return false;
    }

    if (restart) {
        file = open_existing_wfile(outfname, NULL);
    } else {
        file = open_new_file(outfname, GET_PERMISSIONS(attrs, -1));
    }

    if (!file) {
        with_stripctrl(san, outfname)
            printf("local: unable to open %s\n", san);

        req = fxp_close_send(fh);
        pktin = sftp_wait_for_reply(req);
        fxp_close_recv(pktin, req);

        return false;
    }

    if (restart) {
        if (seek_file(file, 0, FROM_END) == -1) {
            close_wfile(file);
            with_stripctrl(san, outfname)
                printf("reget: cannot restart %s - file too large\n", san);
            req = fxp_close_send(fh);
            pktin = sftp_wait_for_reply(req);
            fxp_close_recv(pktin, req);

            return false;
        }

        offset = get_file_posn(file);
        printf("reget: restarting at file position %"PRIu64"\n", offset);
    } else {
        offset = 0;
    }

    with_stripctrl(san, fname) {
        with_stripctrl(sano, outfname)
            printf("remote:%s => local:%s\n", san, sano);
    }

    /*
     * FIXME: we can use FXP_FSTAT here to get the file size, and
     * thus put up a progress bar.
     */
    toret = true;
    xfer = xfer_download_init(fh, offset);
    while (!xfer_done(xfer)) {
        void *vbuf;
        int retd, len;
        int wpos, wlen;

        xfer_download_queue(xfer);
        pktin = sftp_recv();
        retd = xfer_download_gotpkt(xfer, pktin);
        if (retd <= 0) {
            if (!shown_err) {
                printf("error while reading: %s\n", fxp_error());
                shown_err = true;
            }
            if (retd == INT_MIN)        /* pktin not even freed */
                sfree(pktin);
            toret = false;
        }

        while (xfer_download_data(xfer, &vbuf, &len)) {
            unsigned char *buf = (unsigned char *)vbuf;

            wpos = 0;
            while (wpos < len) {
                wlen = write_to_file(file, buf + wpos, len - wpos);
                if (wlen <= 0) {
                    printf("error while writing local file\n");
                    toret = false;
                    xfer_set_error(xfer);
                    break;
                }
                wpos += wlen;
            }
            if (wpos < len) {          /* we had an error */
                toret = false;
                xfer_set_error(xfer);
            }

            sfree(vbuf);
        }
    }

    xfer_cleanup(xfer);

    close_wfile(file);

    req = fxp_close_send(fh);
    pktin = sftp_wait_for_reply(req);
    fxp_close_recv(pktin, req);

    return toret;
}